

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  istream *piVar1;
  long *plVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  double value;
  IStringStream is;
  ValueHolder local_210;
  long local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  local_210.string_ = (char *)&local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)&local_210.bool_,_S_in);
  if (local_210 != &local_200) {
    operator_delete(local_210.string_,local_200._M_allocated_capacity + 1);
  }
  piVar1 = std::istream::_M_extract<double>((double *)local_1a8);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    Value::Value((Value *)&local_210,0.0);
    Value::operator=(decoded,(Value *)&local_210);
    Value::~Value((Value *)&local_210);
    bVar5 = true;
  }
  else {
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,token->start_,token->end_);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x13d7c7);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_1d8 = *plVar3;
      lStack_1d0 = plVar2[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar3;
      local_1e8 = (long *)*plVar2;
    }
    local_1e0 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 == paVar4) {
      local_200._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_200._8_8_ = plVar2[3];
      local_210.string_ = (char *)&local_200;
    }
    else {
      local_200._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_210.string_ = ((char *)*plVar2).string_;
    }
    local_208 = plVar2[1];
    *plVar2 = (long)paVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    addError(this,(String *)&local_210,token,(Location)0x0);
    if (local_210 != &local_200) {
      operator_delete(local_210.string_,local_200._M_allocated_capacity + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    bVar5 = false;
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  return bVar5;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  IStringStream is(String(token.start_, token.end_));
  if (!(is >> value)) {
    if (value == std::numeric_limits<double>::max())
      value = std::numeric_limits<double>::infinity();
    else if (value == std::numeric_limits<double>::lowest())
      value = -std::numeric_limits<double>::infinity();
    else if (!std::isinf(value))
      return addError(
          "'" + String(token.start_, token.end_) + "' is not a number.", token);
  }
  decoded = value;
  return true;
}